

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O1

void av1_avg_cdf_symbols(FRAME_CONTEXT *ctx_left,FRAME_CONTEXT *ctx_tr,int wt_left,int wt_tr)

{
  int iVar1;
  long lVar2;
  aom_cdf_prob (*paaaaVar3) [2] [9] [3];
  aom_cdf_prob (*paaaVar4) [2] [6];
  aom_cdf_prob (*paaaVar5) [2] [7];
  aom_cdf_prob (*paaaVar6) [2] [8];
  aom_cdf_prob (*paaaVar7) [2] [9];
  aom_cdf_prob (*paaaVar8) [2] [10];
  aom_cdf_prob (*paaaVar9) [2] [11];
  aom_cdf_prob (*paaaVar10) [2] [12];
  aom_cdf_prob (*paaaaVar11) [2] [4] [4];
  aom_cdf_prob (*paaaaVar12) [2] [42] [5];
  aom_cdf_prob (*paaaaVar13) [2] [21] [5];
  aom_cdf_prob (*paaVar14) [17];
  aom_cdf_prob (*paaaVar15) [5] [9];
  aom_cdf_prob (*paaaVar16) [6] [3];
  aom_cdf_prob (*paaaVar17) [3] [3];
  aom_cdf_prob (*paaaVar18) [2] [3];
  segmentation_probs *psVar19;
  aom_cdf_prob (*paaVar20) [9];
  aom_cdf_prob (*paaVar21) [3];
  aom_cdf_prob (*paaVar22) [14];
  aom_cdf_prob (*paaaVar23) [13] [15];
  aom_cdf_prob (*paaVar24) [11];
  aom_cdf_prob (*paaVar25) [4];
  aom_cdf_prob (*paaaVar26) [5] [14];
  aom_cdf_prob (*paaVar27) [8];
  aom_cdf_prob (*paaaVar28) [3] [4];
  aom_cdf_prob (*paaVar29) [5];
  aom_cdf_prob (*paaaaVar30) [4] [13] [17];
  aom_cdf_prob (*paaaVar31) [4] [17];
  FRAME_CONTEXT *pFVar32;
  aom_cdf_prob (*paaaaVar33) [2] [9] [3];
  aom_cdf_prob (*paaaVar34) [2] [6];
  aom_cdf_prob (*paaaVar35) [2] [7];
  aom_cdf_prob (*paaaVar36) [2] [8];
  aom_cdf_prob (*paaaVar37) [2] [9];
  aom_cdf_prob (*paaaVar38) [2] [10];
  aom_cdf_prob (*paaaVar39) [2] [11];
  aom_cdf_prob (*paaaVar40) [2] [12];
  aom_cdf_prob (*paaaaVar41) [2] [4] [4];
  aom_cdf_prob (*paaaaVar42) [2] [42] [5];
  aom_cdf_prob (*paaaaVar43) [2] [21] [5];
  aom_cdf_prob (*paaVar44) [17];
  aom_cdf_prob (*paaaVar45) [5] [9];
  aom_cdf_prob (*paaaVar46) [6] [3];
  aom_cdf_prob (*paaaVar47) [3] [3];
  aom_cdf_prob (*paaaVar48) [2] [3];
  segmentation_probs *psVar49;
  aom_cdf_prob (*paaVar50) [9];
  aom_cdf_prob (*paaVar51) [3];
  aom_cdf_prob (*paaVar52) [14];
  aom_cdf_prob (*paaaVar53) [13] [15];
  aom_cdf_prob (*paaVar54) [11];
  aom_cdf_prob (*paaVar55) [4];
  aom_cdf_prob (*paaaVar56) [5] [14];
  aom_cdf_prob (*paaVar57) [8];
  aom_cdf_prob (*paaaVar58) [3] [4];
  aom_cdf_prob (*paaVar59) [5];
  aom_cdf_prob (*paaaaVar60) [4] [13] [17];
  aom_cdf_prob (*paaaVar61) [4] [17];
  FRAME_CONTEXT *pFVar62;
  aom_cdf_prob (*paaaVar63) [5] [9];
  ulong uVar64;
  int j;
  long lVar65;
  aom_cdf_prob (*paaaVar66) [5] [9];
  aom_cdf_prob *cdf_ptr_tr;
  aom_cdf_prob *cdf_ptr_left;
  aom_cdf_prob (*paaaVar67) [5] [9];
  aom_cdf_prob (*paaaVar68) [5] [9];
  long lVar69;
  int iVar70;
  int i_27;
  
  iVar1 = wt_tr + wt_left;
  iVar70 = iVar1 / 2;
  lVar2 = 0;
  pFVar32 = ctx_left;
  pFVar62 = ctx_tr;
  do {
    lVar65 = 0;
    do {
      pFVar32->txb_skip_cdf[0][0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)pFVar32->txb_skip_cdf[0][0][lVar65] * wt_left + iVar70 +
                 (uint)pFVar62->txb_skip_cdf[0][0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    pFVar62 = (FRAME_CONTEXT *)(pFVar62->txb_skip_cdf[0] + 1);
    pFVar32 = (FRAME_CONTEXT *)(pFVar32->txb_skip_cdf[0] + 1);
  } while (lVar2 != 0x41);
  paaaaVar33 = ctx_left->eob_extra_cdf;
  paaaaVar3 = ctx_tr->eob_extra_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaaVar33)[0][0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaaVar33)[0][0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaaVar3)[0][0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaaaVar3 = (aom_cdf_prob (*) [2] [9] [3])((*paaaaVar3)[0] + 1);
    paaaaVar33 = (aom_cdf_prob (*) [2] [9] [3])((*paaaaVar33)[0] + 1);
  } while (lVar2 != 0x5a);
  paaaVar47 = ctx_left->dc_sign_cdf;
  paaaVar17 = ctx_tr->dc_sign_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar47)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar47)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar17)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaaVar17 = (aom_cdf_prob (*) [3] [3])(*paaaVar17 + 1);
    paaaVar47 = (aom_cdf_prob (*) [3] [3])(*paaaVar47 + 1);
  } while (lVar2 != 6);
  paaaVar34 = ctx_left->eob_flag_cdf16;
  paaaVar4 = ctx_tr->eob_flag_cdf16;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar34)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar34)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar4)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 6);
    lVar2 = lVar2 + 1;
    paaaVar4 = (aom_cdf_prob (*) [2] [6])(*paaaVar4 + 1);
    paaaVar34 = (aom_cdf_prob (*) [2] [6])(*paaaVar34 + 1);
  } while (lVar2 != 4);
  paaaVar35 = ctx_left->eob_flag_cdf32;
  paaaVar5 = ctx_tr->eob_flag_cdf32;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar35)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar35)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar5)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 7);
    lVar2 = lVar2 + 1;
    paaaVar5 = (aom_cdf_prob (*) [2] [7])(*paaaVar5 + 1);
    paaaVar35 = (aom_cdf_prob (*) [2] [7])(*paaaVar35 + 1);
  } while (lVar2 != 4);
  paaaVar36 = ctx_left->eob_flag_cdf64;
  paaaVar6 = ctx_tr->eob_flag_cdf64;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar36)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar36)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar6)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 8);
    lVar2 = lVar2 + 1;
    paaaVar6 = (aom_cdf_prob (*) [2] [8])(*paaaVar6 + 1);
    paaaVar36 = (aom_cdf_prob (*) [2] [8])(*paaaVar36 + 1);
  } while (lVar2 != 4);
  paaaVar37 = ctx_left->eob_flag_cdf128;
  paaaVar7 = ctx_tr->eob_flag_cdf128;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar37)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar37)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar7)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 9);
    lVar2 = lVar2 + 1;
    paaaVar7 = (aom_cdf_prob (*) [2] [9])(*paaaVar7 + 1);
    paaaVar37 = (aom_cdf_prob (*) [2] [9])(*paaaVar37 + 1);
  } while (lVar2 != 4);
  paaaVar38 = ctx_left->eob_flag_cdf256;
  paaaVar8 = ctx_tr->eob_flag_cdf256;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar38)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar38)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar8)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 10);
    lVar2 = lVar2 + 1;
    paaaVar8 = (aom_cdf_prob (*) [2] [10])(*paaaVar8 + 1);
    paaaVar38 = (aom_cdf_prob (*) [2] [10])(*paaaVar38 + 1);
  } while (lVar2 != 4);
  paaaVar39 = ctx_left->eob_flag_cdf512;
  paaaVar9 = ctx_tr->eob_flag_cdf512;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar39)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar39)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar9)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 0xb);
    lVar2 = lVar2 + 1;
    paaaVar9 = (aom_cdf_prob (*) [2] [11])(*paaaVar9 + 1);
    paaaVar39 = (aom_cdf_prob (*) [2] [11])(*paaaVar39 + 1);
  } while (lVar2 != 4);
  paaaVar40 = ctx_left->eob_flag_cdf1024;
  paaaVar10 = ctx_tr->eob_flag_cdf1024;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar40)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar40)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar10)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 0xc);
    lVar2 = lVar2 + 1;
    paaaVar10 = (aom_cdf_prob (*) [2] [12])(*paaaVar10 + 1);
    paaaVar40 = (aom_cdf_prob (*) [2] [12])(*paaaVar40 + 1);
  } while (lVar2 != 4);
  paaaaVar41 = ctx_left->coeff_base_eob_cdf;
  paaaaVar11 = ctx_tr->coeff_base_eob_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaaVar41)[0][0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaaVar41)[0][0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaaVar11)[0][0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 4);
    lVar2 = lVar2 + 1;
    paaaaVar11 = (aom_cdf_prob (*) [2] [4] [4])((*paaaaVar11)[0] + 1);
    paaaaVar41 = (aom_cdf_prob (*) [2] [4] [4])((*paaaaVar41)[0] + 1);
  } while (lVar2 != 0x28);
  paaaaVar42 = ctx_left->coeff_base_cdf;
  paaaaVar12 = ctx_tr->coeff_base_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaaVar42)[0][0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaaVar42)[0][0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaaVar12)[0][0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 5);
    lVar2 = lVar2 + 1;
    paaaaVar12 = (aom_cdf_prob (*) [2] [42] [5])((*paaaaVar12)[0] + 1);
    paaaaVar42 = (aom_cdf_prob (*) [2] [42] [5])((*paaaaVar42)[0] + 1);
  } while (lVar2 != 0x1a4);
  paaaaVar43 = ctx_left->coeff_br_cdf;
  paaaaVar13 = ctx_tr->coeff_br_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaaVar43)[0][0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaaVar43)[0][0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaaVar13)[0][0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 5);
    lVar2 = lVar2 + 1;
    paaaaVar13 = (aom_cdf_prob (*) [2] [21] [5])((*paaaaVar13)[0] + 1);
    paaaaVar43 = (aom_cdf_prob (*) [2] [21] [5])((*paaaaVar43)[0] + 1);
  } while (lVar2 != 0xd2);
  paaVar51 = ctx_left->newmv_cdf;
  paaVar21 = ctx_tr->newmv_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar51)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar51)[lVar65] * wt_left + iVar70 + (uint)(*paaVar21)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaVar21 = paaVar21 + 1;
    paaVar51 = paaVar51 + 1;
  } while (lVar2 != 6);
  paaVar51 = ctx_left->zeromv_cdf;
  paaVar21 = ctx_tr->zeromv_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar51)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar51)[lVar65] * wt_left + iVar70 + (uint)(*paaVar21)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaVar21 = paaVar21 + 1;
    paaVar51 = paaVar51 + 1;
  } while (lVar2 != 2);
  paaVar51 = ctx_left->refmv_cdf;
  paaVar21 = ctx_tr->refmv_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar51)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar51)[lVar65] * wt_left + iVar70 + (uint)(*paaVar21)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaVar21 = paaVar21 + 1;
    paaVar51 = paaVar51 + 1;
  } while (lVar2 != 6);
  paaVar51 = ctx_left->drl_cdf;
  paaVar21 = ctx_tr->drl_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar51)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar51)[lVar65] * wt_left + iVar70 + (uint)(*paaVar21)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaVar21 = paaVar21 + 1;
    paaVar51 = paaVar51 + 1;
  } while (lVar2 != 3);
  paaVar50 = ctx_left->inter_compound_mode_cdf;
  paaVar20 = ctx_tr->inter_compound_mode_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar50)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar50)[lVar65] * wt_left + iVar70 + (uint)(*paaVar20)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 9);
    lVar2 = lVar2 + 1;
    paaVar20 = paaVar20 + 1;
    paaVar50 = paaVar50 + 1;
  } while (lVar2 != 8);
  paaVar51 = ctx_left->compound_type_cdf;
  paaVar21 = ctx_tr->compound_type_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar51)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar51)[lVar65] * wt_left + iVar70 + (uint)(*paaVar21)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaVar21 = paaVar21 + 1;
    paaVar51 = paaVar51 + 1;
  } while (lVar2 != 0x16);
  paaVar44 = ctx_left->wedge_idx_cdf;
  paaVar14 = ctx_tr->wedge_idx_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar44)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar44)[lVar65] * wt_left + iVar70 + (uint)(*paaVar14)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 0x11);
    lVar2 = lVar2 + 1;
    paaVar14 = paaVar14 + 1;
    paaVar44 = paaVar44 + 1;
  } while (lVar2 != 0x16);
  paaVar51 = ctx_left->interintra_cdf;
  paaVar21 = ctx_tr->interintra_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar51)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar51)[lVar65] * wt_left + iVar70 + (uint)(*paaVar21)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaVar21 = paaVar21 + 1;
    paaVar51 = paaVar51 + 1;
  } while (lVar2 != 4);
  paaVar51 = ctx_left->wedge_interintra_cdf;
  paaVar21 = ctx_tr->wedge_interintra_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar51)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar51)[lVar65] * wt_left + iVar70 + (uint)(*paaVar21)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaVar21 = paaVar21 + 1;
    paaVar51 = paaVar51 + 1;
  } while (lVar2 != 0x16);
  paaVar59 = ctx_left->interintra_mode_cdf;
  paaVar29 = ctx_tr->interintra_mode_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar59)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar59)[lVar65] * wt_left + iVar70 + (uint)(*paaVar29)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 5);
    lVar2 = lVar2 + 1;
    paaVar29 = paaVar29 + 1;
    paaVar59 = paaVar59 + 1;
  } while (lVar2 != 4);
  paaVar55 = ctx_left->motion_mode_cdf;
  paaVar25 = ctx_tr->motion_mode_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar55)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar55)[lVar65] * wt_left + iVar70 + (uint)(*paaVar25)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 4);
    lVar2 = lVar2 + 1;
    paaVar25 = paaVar25 + 1;
    paaVar55 = paaVar55 + 1;
  } while (lVar2 != 0x16);
  paaVar51 = ctx_left->obmc_cdf;
  paaVar21 = ctx_tr->obmc_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar51)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar51)[lVar65] * wt_left + iVar70 + (uint)(*paaVar21)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaVar21 = paaVar21 + 1;
    paaVar51 = paaVar51 + 1;
  } while (lVar2 != 0x16);
  paaVar57 = ctx_left->palette_y_size_cdf;
  paaVar27 = ctx_tr->palette_y_size_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar57)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar57)[lVar65] * wt_left + iVar70 + (uint)(*paaVar27)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 8);
    lVar2 = lVar2 + 1;
    paaVar27 = paaVar27 + 1;
    paaVar57 = paaVar57 + 1;
  } while (lVar2 != 7);
  paaVar57 = ctx_left->palette_uv_size_cdf;
  paaVar27 = ctx_tr->palette_uv_size_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar57)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar57)[lVar65] * wt_left + iVar70 + (uint)(*paaVar27)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 8);
    lVar2 = lVar2 + 1;
    paaVar27 = paaVar27 + 1;
    paaVar57 = paaVar57 + 1;
  } while (lVar2 != 7);
  paaaVar45 = ctx_left->palette_y_color_index_cdf;
  paaaVar15 = ctx_tr->palette_y_color_index_cdf;
  paaaVar66 = ctx_left->palette_uv_color_index_cdf;
  paaaVar63 = ctx_tr->palette_uv_color_index_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    paaaVar67 = paaaVar45;
    paaaVar68 = paaaVar15;
    do {
      lVar69 = -3;
      do {
        (*paaaVar67)[0][lVar69 + 3] =
             (aom_cdf_prob)
             ((int)((uint)(*paaaVar67)[0][lVar69 + 3] * wt_left + iVar70 +
                   (uint)(*paaaVar68)[0][lVar69 + 3] * wt_tr) / iVar1);
        lVar69 = lVar69 + 1;
      } while (lVar2 != lVar69);
      lVar65 = lVar65 + 1;
      paaaVar68 = (aom_cdf_prob (*) [5] [9])(*paaaVar68 + 1);
      paaaVar67 = (aom_cdf_prob (*) [5] [9])(*paaaVar67 + 1);
    } while (lVar65 != 5);
    lVar65 = 0;
    paaaVar67 = paaaVar66;
    paaaVar68 = paaaVar63;
    do {
      lVar69 = -3;
      do {
        (*paaaVar67)[0][lVar69 + 3] =
             (aom_cdf_prob)
             ((int)((uint)(*paaaVar67)[0][lVar69 + 3] * wt_left + iVar70 +
                   (uint)(*paaaVar68)[0][lVar69 + 3] * wt_tr) / iVar1);
        lVar69 = lVar69 + 1;
      } while (lVar2 != lVar69);
      lVar65 = lVar65 + 1;
      paaaVar68 = (aom_cdf_prob (*) [5] [9])(*paaaVar68 + 1);
      paaaVar67 = (aom_cdf_prob (*) [5] [9])(*paaaVar67 + 1);
    } while (lVar65 != 5);
    lVar2 = lVar2 + 1;
    paaaVar15 = paaaVar15 + 1;
    paaaVar45 = paaaVar45 + 1;
    paaaVar63 = paaaVar63 + 1;
    paaaVar66 = paaaVar66 + 1;
  } while (lVar2 != 7);
  paaaVar47 = ctx_left->palette_y_mode_cdf;
  paaaVar17 = ctx_tr->palette_y_mode_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar47)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar47)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar17)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaaVar17 = (aom_cdf_prob (*) [3] [3])(*paaaVar17 + 1);
    paaaVar47 = (aom_cdf_prob (*) [3] [3])(*paaaVar47 + 1);
  } while (lVar2 != 0x15);
  paaVar51 = ctx_left->palette_uv_mode_cdf;
  paaVar21 = ctx_tr->palette_uv_mode_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar51)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar51)[lVar65] * wt_left + iVar70 + (uint)(*paaVar21)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaVar21 = paaVar21 + 1;
    paaVar51 = paaVar51 + 1;
  } while (lVar2 != 2);
  paaVar51 = ctx_left->comp_inter_cdf;
  paaVar21 = ctx_tr->comp_inter_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar51)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar51)[lVar65] * wt_left + iVar70 + (uint)(*paaVar21)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaVar21 = paaVar21 + 1;
    paaVar51 = paaVar51 + 1;
  } while (lVar2 != 5);
  paaaVar46 = ctx_left->single_ref_cdf;
  paaaVar16 = ctx_tr->single_ref_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar46)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar46)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar16)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaaVar16 = (aom_cdf_prob (*) [6] [3])(*paaaVar16 + 1);
    paaaVar46 = (aom_cdf_prob (*) [6] [3])(*paaaVar46 + 1);
  } while (lVar2 != 0x12);
  paaVar51 = ctx_left->comp_ref_type_cdf;
  paaVar21 = ctx_tr->comp_ref_type_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar51)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar51)[lVar65] * wt_left + iVar70 + (uint)(*paaVar21)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaVar21 = paaVar21 + 1;
    paaVar51 = paaVar51 + 1;
  } while (lVar2 != 5);
  paaaVar47 = ctx_left->uni_comp_ref_cdf;
  paaaVar17 = ctx_tr->uni_comp_ref_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar47)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar47)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar17)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaaVar17 = (aom_cdf_prob (*) [3] [3])(*paaaVar17 + 1);
    paaaVar47 = (aom_cdf_prob (*) [3] [3])(*paaaVar47 + 1);
  } while (lVar2 != 9);
  paaaVar47 = ctx_left->comp_ref_cdf;
  paaaVar17 = ctx_tr->comp_ref_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar47)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar47)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar17)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaaVar17 = (aom_cdf_prob (*) [3] [3])(*paaaVar17 + 1);
    paaaVar47 = (aom_cdf_prob (*) [3] [3])(*paaaVar47 + 1);
  } while (lVar2 != 9);
  paaaVar48 = ctx_left->comp_bwdref_cdf;
  paaaVar18 = ctx_tr->comp_bwdref_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar48)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar48)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar18)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaaVar18 = (aom_cdf_prob (*) [2] [3])(*paaaVar18 + 1);
    paaaVar48 = (aom_cdf_prob (*) [2] [3])(*paaaVar48 + 1);
  } while (lVar2 != 6);
  paaVar51 = ctx_left->txfm_partition_cdf;
  paaVar21 = ctx_tr->txfm_partition_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar51)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar51)[lVar65] * wt_left + iVar70 + (uint)(*paaVar21)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaVar21 = paaVar21 + 1;
    paaVar51 = paaVar51 + 1;
  } while (lVar2 != 0x15);
  paaVar51 = ctx_left->compound_index_cdf;
  paaVar21 = ctx_tr->compound_index_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar51)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar51)[lVar65] * wt_left + iVar70 + (uint)(*paaVar21)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaVar21 = paaVar21 + 1;
    paaVar51 = paaVar51 + 1;
  } while (lVar2 != 6);
  paaVar51 = ctx_left->comp_group_idx_cdf;
  paaVar21 = ctx_tr->comp_group_idx_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar51)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar51)[lVar65] * wt_left + iVar70 + (uint)(*paaVar21)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaVar21 = paaVar21 + 1;
    paaVar51 = paaVar51 + 1;
  } while (lVar2 != 6);
  paaVar51 = ctx_left->skip_mode_cdfs;
  paaVar21 = ctx_tr->skip_mode_cdfs;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar51)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar51)[lVar65] * wt_left + iVar70 + (uint)(*paaVar21)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaVar21 = paaVar21 + 1;
    paaVar51 = paaVar51 + 1;
  } while (lVar2 != 3);
  paaVar51 = ctx_left->skip_txfm_cdfs;
  paaVar21 = ctx_tr->skip_txfm_cdfs;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar51)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar51)[lVar65] * wt_left + iVar70 + (uint)(*paaVar21)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaVar21 = paaVar21 + 1;
    paaVar51 = paaVar51 + 1;
  } while (lVar2 != 3);
  paaVar51 = ctx_left->intra_inter_cdf;
  paaVar21 = ctx_tr->intra_inter_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar51)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar51)[lVar65] * wt_left + iVar70 + (uint)(*paaVar21)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaVar21 = paaVar21 + 1;
    paaVar51 = paaVar51 + 1;
  } while (lVar2 != 4);
  avg_nmv(&ctx_left->nmvc,&ctx_tr->nmvc,wt_left,wt_tr);
  avg_nmv(&ctx_left->ndvc,&ctx_tr->ndvc,wt_left,wt_tr);
  lVar2 = 0;
  do {
    ctx_left->intrabc_cdf[lVar2] =
         (aom_cdf_prob)
         ((int)((uint)ctx_left->intrabc_cdf[lVar2] * wt_left + iVar70 +
               (uint)ctx_tr->intrabc_cdf[lVar2] * wt_tr) / iVar1);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  psVar49 = &ctx_left->seg;
  psVar19 = &ctx_tr->seg;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      psVar49->pred_cdf[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)psVar49->pred_cdf[0][lVar65] * wt_left + iVar70 +
                 (uint)psVar19->pred_cdf[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    psVar19 = (segmentation_probs *)(psVar19->pred_cdf + 1);
    psVar49 = (segmentation_probs *)(psVar49->pred_cdf + 1);
  } while (lVar2 != 3);
  paaVar50 = (ctx_left->seg).spatial_pred_seg_cdf;
  paaVar20 = (ctx_tr->seg).spatial_pred_seg_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar50)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar50)[lVar65] * wt_left + iVar70 + (uint)(*paaVar20)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 9);
    lVar2 = lVar2 + 1;
    paaVar20 = paaVar20 + 1;
    paaVar50 = paaVar50 + 1;
  } while (lVar2 != 3);
  paaVar51 = ctx_left->filter_intra_cdfs;
  paaVar21 = ctx_tr->filter_intra_cdfs;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar51)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar51)[lVar65] * wt_left + iVar70 + (uint)(*paaVar21)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaVar21 = paaVar21 + 1;
    paaVar51 = paaVar51 + 1;
  } while (lVar2 != 0x16);
  lVar2 = 0;
  do {
    ctx_left->filter_intra_mode_cdf[lVar2] =
         (aom_cdf_prob)
         ((int)((uint)ctx_left->filter_intra_mode_cdf[lVar2] * wt_left + iVar70 +
               (uint)ctx_tr->filter_intra_mode_cdf[lVar2] * wt_tr) / iVar1);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 6);
  lVar2 = 0;
  do {
    ctx_left->switchable_restore_cdf[lVar2] =
         (aom_cdf_prob)
         ((int)((uint)ctx_left->switchable_restore_cdf[lVar2] * wt_left + iVar70 +
               (uint)ctx_tr->switchable_restore_cdf[lVar2] * wt_tr) / iVar1);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  lVar2 = 0;
  do {
    ctx_left->wiener_restore_cdf[lVar2] =
         (aom_cdf_prob)
         ((int)((uint)ctx_left->wiener_restore_cdf[lVar2] * wt_left + iVar70 +
               (uint)ctx_tr->wiener_restore_cdf[lVar2] * wt_tr) / iVar1);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    ctx_left->sgrproj_restore_cdf[lVar2] =
         (aom_cdf_prob)
         ((int)((uint)ctx_left->sgrproj_restore_cdf[lVar2] * wt_left + iVar70 +
               (uint)ctx_tr->sgrproj_restore_cdf[lVar2] * wt_tr) / iVar1);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  paaVar52 = ctx_left->y_mode_cdf;
  paaVar22 = ctx_tr->y_mode_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar52)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar52)[lVar65] * wt_left + iVar70 + (uint)(*paaVar22)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 0xe);
    lVar2 = lVar2 + 1;
    paaVar22 = paaVar22 + 1;
    paaVar52 = paaVar52 + 1;
  } while (lVar2 != 4);
  paaaVar53 = ctx_left->uv_mode_cdf;
  paaaVar23 = ctx_tr->uv_mode_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar53)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar53)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar23)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 0xe);
    lVar2 = lVar2 + 1;
    paaaVar23 = (aom_cdf_prob (*) [13] [15])(*paaaVar23 + 1);
    paaaVar53 = (aom_cdf_prob (*) [13] [15])(*paaaVar53 + 1);
  } while (lVar2 != 0xd);
  paaaVar53 = ctx_left->uv_mode_cdf + 1;
  paaaVar23 = ctx_tr->uv_mode_cdf + 1;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar53)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar53)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar23)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 0xf);
    lVar2 = lVar2 + 1;
    paaaVar23 = (aom_cdf_prob (*) [13] [15])(*paaaVar23 + 1);
    paaaVar53 = (aom_cdf_prob (*) [13] [15])(*paaaVar53 + 1);
  } while (lVar2 != 0xd);
  paaVar54 = ctx_left->partition_cdf;
  paaVar24 = ctx_tr->partition_cdf;
  uVar64 = 0;
  do {
    lVar2 = 0;
    if (uVar64 < 4) {
      do {
        (*paaVar54)[lVar2] =
             (aom_cdf_prob)
             ((int)((uint)(*paaVar54)[lVar2] * wt_left + iVar70 + (uint)(*paaVar24)[lVar2] * wt_tr)
             / iVar1);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 5);
    }
    else if (uVar64 < 0x10) {
      do {
        (*paaVar54)[lVar2] =
             (aom_cdf_prob)
             ((int)((uint)(*paaVar54)[lVar2] * wt_left + iVar70 + (uint)(*paaVar24)[lVar2] * wt_tr)
             / iVar1);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0xb);
    }
    else {
      do {
        (*paaVar54)[lVar2] =
             (aom_cdf_prob)
             ((int)((uint)(*paaVar54)[lVar2] * wt_left + iVar70 + (uint)(*paaVar24)[lVar2] * wt_tr)
             / iVar1);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 9);
    }
    uVar64 = uVar64 + 1;
    paaVar54 = paaVar54 + 1;
    paaVar24 = paaVar24 + 1;
  } while (uVar64 != 0x14);
  paaVar55 = ctx_left->switchable_interp_cdf;
  paaVar25 = ctx_tr->switchable_interp_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar55)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar55)[lVar65] * wt_left + iVar70 + (uint)(*paaVar25)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 4);
    lVar2 = lVar2 + 1;
    paaVar25 = paaVar25 + 1;
    paaVar55 = paaVar55 + 1;
  } while (lVar2 != 0x10);
  paaaVar56 = ctx_left->kf_y_cdf;
  paaaVar26 = ctx_tr->kf_y_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar56)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar56)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar26)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 0xe);
    lVar2 = lVar2 + 1;
    paaaVar26 = (aom_cdf_prob (*) [5] [14])(*paaaVar26 + 1);
    paaaVar56 = (aom_cdf_prob (*) [5] [14])(*paaaVar56 + 1);
  } while (lVar2 != 0x19);
  paaVar57 = ctx_left->angle_delta_cdf;
  paaVar27 = ctx_tr->angle_delta_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar57)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar57)[lVar65] * wt_left + iVar70 + (uint)(*paaVar27)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 8);
    lVar2 = lVar2 + 1;
    paaVar27 = paaVar27 + 1;
    paaVar57 = paaVar57 + 1;
  } while (lVar2 != 8);
  paaaVar58 = ctx_left->tx_size_cdf;
  paaaVar28 = ctx_tr->tx_size_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar58)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar58)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar28)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaaVar28 = (aom_cdf_prob (*) [3] [4])(*paaaVar28 + 1);
    paaaVar58 = (aom_cdf_prob (*) [3] [4])(*paaaVar58 + 1);
  } while (lVar2 != 3);
  paaaVar58 = ctx_left->tx_size_cdf + 1;
  paaaVar28 = ctx_tr->tx_size_cdf + 1;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar58)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar58)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar28)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 4);
    lVar2 = lVar2 + 1;
    paaaVar28 = (aom_cdf_prob (*) [3] [4])(*paaaVar28 + 1);
    paaaVar58 = (aom_cdf_prob (*) [3] [4])(*paaaVar58 + 1);
  } while (lVar2 != 3);
  paaaVar58 = ctx_left->tx_size_cdf + 2;
  paaaVar28 = ctx_tr->tx_size_cdf + 2;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar58)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar58)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar28)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 4);
    lVar2 = lVar2 + 1;
    paaaVar28 = (aom_cdf_prob (*) [3] [4])(*paaaVar28 + 1);
    paaaVar58 = (aom_cdf_prob (*) [3] [4])(*paaaVar58 + 1);
  } while (lVar2 != 3);
  paaaVar58 = ctx_left->tx_size_cdf + 3;
  paaaVar28 = ctx_tr->tx_size_cdf + 3;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar58)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar58)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar28)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 4);
    lVar2 = lVar2 + 1;
    paaaVar28 = (aom_cdf_prob (*) [3] [4])(*paaaVar28 + 1);
    paaaVar58 = (aom_cdf_prob (*) [3] [4])(*paaaVar58 + 1);
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    ctx_left->delta_q_cdf[lVar2] =
         (aom_cdf_prob)
         ((int)((uint)ctx_left->delta_q_cdf[lVar2] * wt_left + iVar70 +
               (uint)ctx_tr->delta_q_cdf[lVar2] * wt_tr) / iVar1);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  lVar2 = 0;
  do {
    ctx_left->delta_lf_cdf[lVar2] =
         (aom_cdf_prob)
         ((int)((uint)ctx_left->delta_lf_cdf[lVar2] * wt_left + iVar70 +
               (uint)ctx_tr->delta_lf_cdf[lVar2] * wt_tr) / iVar1);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  paaVar59 = ctx_left->delta_lf_multi_cdf;
  paaVar29 = ctx_tr->delta_lf_multi_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar59)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar59)[lVar65] * wt_left + iVar70 + (uint)(*paaVar29)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 5);
    lVar2 = lVar2 + 1;
    paaVar59 = paaVar59 + 1;
    paaVar29 = paaVar29 + 1;
  } while (lVar2 != 4);
  paaaaVar60 = ctx_left->intra_ext_tx_cdf + 1;
  paaaaVar30 = ctx_tr->intra_ext_tx_cdf + 1;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaaVar60)[0][0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaaVar60)[0][0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaaVar30)[0][0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 8);
    lVar2 = lVar2 + 1;
    paaaaVar30 = (aom_cdf_prob (*) [4] [13] [17])((*paaaaVar30)[0] + 1);
    paaaaVar60 = (aom_cdf_prob (*) [4] [13] [17])((*paaaaVar60)[0] + 1);
  } while (lVar2 != 0x34);
  paaaaVar60 = ctx_left->intra_ext_tx_cdf + 2;
  paaaaVar30 = ctx_tr->intra_ext_tx_cdf + 2;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaaVar60)[0][0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaaVar60)[0][0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaaVar30)[0][0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 6);
    lVar2 = lVar2 + 1;
    paaaaVar30 = (aom_cdf_prob (*) [4] [13] [17])((*paaaaVar30)[0] + 1);
    paaaaVar60 = (aom_cdf_prob (*) [4] [13] [17])((*paaaaVar60)[0] + 1);
  } while (lVar2 != 0x34);
  paaaVar61 = ctx_left->inter_ext_tx_cdf + 1;
  paaaVar31 = ctx_tr->inter_ext_tx_cdf + 1;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar61)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar61)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar31)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 0x11);
    lVar2 = lVar2 + 1;
    paaaVar31 = (aom_cdf_prob (*) [4] [17])(*paaaVar31 + 1);
    paaaVar61 = (aom_cdf_prob (*) [4] [17])(*paaaVar61 + 1);
  } while (lVar2 != 4);
  paaaVar61 = ctx_left->inter_ext_tx_cdf + 2;
  paaaVar31 = ctx_tr->inter_ext_tx_cdf + 2;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar61)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar61)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar31)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 0xd);
    lVar2 = lVar2 + 1;
    paaaVar31 = (aom_cdf_prob (*) [4] [17])(*paaaVar31 + 1);
    paaaVar61 = (aom_cdf_prob (*) [4] [17])(*paaaVar61 + 1);
  } while (lVar2 != 4);
  paaaVar61 = ctx_left->inter_ext_tx_cdf + 3;
  paaaVar31 = ctx_tr->inter_ext_tx_cdf + 3;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaaVar61)[0][lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaaVar61)[0][lVar65] * wt_left + iVar70 +
                 (uint)(*paaaVar31)[0][lVar65] * wt_tr) / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 3);
    lVar2 = lVar2 + 1;
    paaaVar31 = (aom_cdf_prob (*) [4] [17])(*paaaVar31 + 1);
    paaaVar61 = (aom_cdf_prob (*) [4] [17])(*paaaVar61 + 1);
  } while (lVar2 != 4);
  lVar2 = 0;
  do {
    ctx_left->cfl_sign_cdf[lVar2] =
         (aom_cdf_prob)
         ((int)((uint)ctx_left->cfl_sign_cdf[lVar2] * wt_left + iVar70 +
               (uint)ctx_tr->cfl_sign_cdf[lVar2] * wt_tr) / iVar1);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 9);
  paaVar44 = ctx_left->cfl_alpha_cdf;
  paaVar14 = ctx_tr->cfl_alpha_cdf;
  lVar2 = 0;
  do {
    lVar65 = 0;
    do {
      (*paaVar44)[lVar65] =
           (aom_cdf_prob)
           ((int)((uint)(*paaVar44)[lVar65] * wt_left + iVar70 + (uint)(*paaVar14)[lVar65] * wt_tr)
           / iVar1);
      lVar65 = lVar65 + 1;
    } while (lVar65 != 0x11);
    lVar2 = lVar2 + 1;
    paaVar14 = paaVar14 + 1;
    paaVar44 = paaVar44 + 1;
  } while (lVar2 != 6);
  return;
}

Assistant:

void av1_avg_cdf_symbols(FRAME_CONTEXT *ctx_left, FRAME_CONTEXT *ctx_tr,
                         int wt_left, int wt_tr) {
  AVERAGE_CDF(ctx_left->txb_skip_cdf, ctx_tr->txb_skip_cdf, 2);
  AVERAGE_CDF(ctx_left->eob_extra_cdf, ctx_tr->eob_extra_cdf, 2);
  AVERAGE_CDF(ctx_left->dc_sign_cdf, ctx_tr->dc_sign_cdf, 2);
  AVERAGE_CDF(ctx_left->eob_flag_cdf16, ctx_tr->eob_flag_cdf16, 5);
  AVERAGE_CDF(ctx_left->eob_flag_cdf32, ctx_tr->eob_flag_cdf32, 6);
  AVERAGE_CDF(ctx_left->eob_flag_cdf64, ctx_tr->eob_flag_cdf64, 7);
  AVERAGE_CDF(ctx_left->eob_flag_cdf128, ctx_tr->eob_flag_cdf128, 8);
  AVERAGE_CDF(ctx_left->eob_flag_cdf256, ctx_tr->eob_flag_cdf256, 9);
  AVERAGE_CDF(ctx_left->eob_flag_cdf512, ctx_tr->eob_flag_cdf512, 10);
  AVERAGE_CDF(ctx_left->eob_flag_cdf1024, ctx_tr->eob_flag_cdf1024, 11);
  AVERAGE_CDF(ctx_left->coeff_base_eob_cdf, ctx_tr->coeff_base_eob_cdf, 3);
  AVERAGE_CDF(ctx_left->coeff_base_cdf, ctx_tr->coeff_base_cdf, 4);
  AVERAGE_CDF(ctx_left->coeff_br_cdf, ctx_tr->coeff_br_cdf, BR_CDF_SIZE);
  AVERAGE_CDF(ctx_left->newmv_cdf, ctx_tr->newmv_cdf, 2);
  AVERAGE_CDF(ctx_left->zeromv_cdf, ctx_tr->zeromv_cdf, 2);
  AVERAGE_CDF(ctx_left->refmv_cdf, ctx_tr->refmv_cdf, 2);
  AVERAGE_CDF(ctx_left->drl_cdf, ctx_tr->drl_cdf, 2);
  AVERAGE_CDF(ctx_left->inter_compound_mode_cdf,
              ctx_tr->inter_compound_mode_cdf, INTER_COMPOUND_MODES);
  AVERAGE_CDF(ctx_left->compound_type_cdf, ctx_tr->compound_type_cdf,
              MASKED_COMPOUND_TYPES);
  AVERAGE_CDF(ctx_left->wedge_idx_cdf, ctx_tr->wedge_idx_cdf, 16);
  AVERAGE_CDF(ctx_left->interintra_cdf, ctx_tr->interintra_cdf, 2);
  AVERAGE_CDF(ctx_left->wedge_interintra_cdf, ctx_tr->wedge_interintra_cdf, 2);
  AVERAGE_CDF(ctx_left->interintra_mode_cdf, ctx_tr->interintra_mode_cdf,
              INTERINTRA_MODES);
  AVERAGE_CDF(ctx_left->motion_mode_cdf, ctx_tr->motion_mode_cdf, MOTION_MODES);
  AVERAGE_CDF(ctx_left->obmc_cdf, ctx_tr->obmc_cdf, 2);
  AVERAGE_CDF(ctx_left->palette_y_size_cdf, ctx_tr->palette_y_size_cdf,
              PALETTE_SIZES);
  AVERAGE_CDF(ctx_left->palette_uv_size_cdf, ctx_tr->palette_uv_size_cdf,
              PALETTE_SIZES);
  for (int j = 0; j < PALETTE_SIZES; j++) {
    int nsymbs = j + PALETTE_MIN_SIZE;
    AVG_CDF_STRIDE(ctx_left->palette_y_color_index_cdf[j],
                   ctx_tr->palette_y_color_index_cdf[j], nsymbs,
                   CDF_SIZE(PALETTE_COLORS));
    AVG_CDF_STRIDE(ctx_left->palette_uv_color_index_cdf[j],
                   ctx_tr->palette_uv_color_index_cdf[j], nsymbs,
                   CDF_SIZE(PALETTE_COLORS));
  }
  AVERAGE_CDF(ctx_left->palette_y_mode_cdf, ctx_tr->palette_y_mode_cdf, 2);
  AVERAGE_CDF(ctx_left->palette_uv_mode_cdf, ctx_tr->palette_uv_mode_cdf, 2);
  AVERAGE_CDF(ctx_left->comp_inter_cdf, ctx_tr->comp_inter_cdf, 2);
  AVERAGE_CDF(ctx_left->single_ref_cdf, ctx_tr->single_ref_cdf, 2);
  AVERAGE_CDF(ctx_left->comp_ref_type_cdf, ctx_tr->comp_ref_type_cdf, 2);
  AVERAGE_CDF(ctx_left->uni_comp_ref_cdf, ctx_tr->uni_comp_ref_cdf, 2);
  AVERAGE_CDF(ctx_left->comp_ref_cdf, ctx_tr->comp_ref_cdf, 2);
  AVERAGE_CDF(ctx_left->comp_bwdref_cdf, ctx_tr->comp_bwdref_cdf, 2);
  AVERAGE_CDF(ctx_left->txfm_partition_cdf, ctx_tr->txfm_partition_cdf, 2);
  AVERAGE_CDF(ctx_left->compound_index_cdf, ctx_tr->compound_index_cdf, 2);
  AVERAGE_CDF(ctx_left->comp_group_idx_cdf, ctx_tr->comp_group_idx_cdf, 2);
  AVERAGE_CDF(ctx_left->skip_mode_cdfs, ctx_tr->skip_mode_cdfs, 2);
  AVERAGE_CDF(ctx_left->skip_txfm_cdfs, ctx_tr->skip_txfm_cdfs, 2);
  AVERAGE_CDF(ctx_left->intra_inter_cdf, ctx_tr->intra_inter_cdf, 2);
  avg_nmv(&ctx_left->nmvc, &ctx_tr->nmvc, wt_left, wt_tr);
  avg_nmv(&ctx_left->ndvc, &ctx_tr->ndvc, wt_left, wt_tr);
  AVERAGE_CDF(ctx_left->intrabc_cdf, ctx_tr->intrabc_cdf, 2);
  AVERAGE_CDF(ctx_left->seg.pred_cdf, ctx_tr->seg.pred_cdf, 2);
  AVERAGE_CDF(ctx_left->seg.spatial_pred_seg_cdf,
              ctx_tr->seg.spatial_pred_seg_cdf, MAX_SEGMENTS);
  AVERAGE_CDF(ctx_left->filter_intra_cdfs, ctx_tr->filter_intra_cdfs, 2);
  AVERAGE_CDF(ctx_left->filter_intra_mode_cdf, ctx_tr->filter_intra_mode_cdf,
              FILTER_INTRA_MODES);
  AVERAGE_CDF(ctx_left->switchable_restore_cdf, ctx_tr->switchable_restore_cdf,
              RESTORE_SWITCHABLE_TYPES);
  AVERAGE_CDF(ctx_left->wiener_restore_cdf, ctx_tr->wiener_restore_cdf, 2);
  AVERAGE_CDF(ctx_left->sgrproj_restore_cdf, ctx_tr->sgrproj_restore_cdf, 2);
  AVERAGE_CDF(ctx_left->y_mode_cdf, ctx_tr->y_mode_cdf, INTRA_MODES);
  AVG_CDF_STRIDE(ctx_left->uv_mode_cdf[0], ctx_tr->uv_mode_cdf[0],
                 UV_INTRA_MODES - 1, CDF_SIZE(UV_INTRA_MODES));
  AVERAGE_CDF(ctx_left->uv_mode_cdf[1], ctx_tr->uv_mode_cdf[1], UV_INTRA_MODES);
  for (int i = 0; i < PARTITION_CONTEXTS; i++) {
    if (i < 4) {
      AVG_CDF_STRIDE(ctx_left->partition_cdf[i], ctx_tr->partition_cdf[i], 4,
                     CDF_SIZE(10));
    } else if (i < 16) {
      AVERAGE_CDF(ctx_left->partition_cdf[i], ctx_tr->partition_cdf[i], 10);
    } else {
      AVG_CDF_STRIDE(ctx_left->partition_cdf[i], ctx_tr->partition_cdf[i], 8,
                     CDF_SIZE(10));
    }
  }
  AVERAGE_CDF(ctx_left->switchable_interp_cdf, ctx_tr->switchable_interp_cdf,
              SWITCHABLE_FILTERS);
  AVERAGE_CDF(ctx_left->kf_y_cdf, ctx_tr->kf_y_cdf, INTRA_MODES);
  AVERAGE_CDF(ctx_left->angle_delta_cdf, ctx_tr->angle_delta_cdf,
              2 * MAX_ANGLE_DELTA + 1);
  AVG_CDF_STRIDE(ctx_left->tx_size_cdf[0], ctx_tr->tx_size_cdf[0], MAX_TX_DEPTH,
                 CDF_SIZE(MAX_TX_DEPTH + 1));
  AVERAGE_CDF(ctx_left->tx_size_cdf[1], ctx_tr->tx_size_cdf[1],
              MAX_TX_DEPTH + 1);
  AVERAGE_CDF(ctx_left->tx_size_cdf[2], ctx_tr->tx_size_cdf[2],
              MAX_TX_DEPTH + 1);
  AVERAGE_CDF(ctx_left->tx_size_cdf[3], ctx_tr->tx_size_cdf[3],
              MAX_TX_DEPTH + 1);
  AVERAGE_CDF(ctx_left->delta_q_cdf, ctx_tr->delta_q_cdf, DELTA_Q_PROBS + 1);
  AVERAGE_CDF(ctx_left->delta_lf_cdf, ctx_tr->delta_lf_cdf, DELTA_LF_PROBS + 1);
  for (int i = 0; i < FRAME_LF_COUNT; i++) {
    AVERAGE_CDF(ctx_left->delta_lf_multi_cdf[i], ctx_tr->delta_lf_multi_cdf[i],
                DELTA_LF_PROBS + 1);
  }
  AVG_CDF_STRIDE(ctx_left->intra_ext_tx_cdf[1], ctx_tr->intra_ext_tx_cdf[1], 7,
                 CDF_SIZE(TX_TYPES));
  AVG_CDF_STRIDE(ctx_left->intra_ext_tx_cdf[2], ctx_tr->intra_ext_tx_cdf[2], 5,
                 CDF_SIZE(TX_TYPES));
  AVG_CDF_STRIDE(ctx_left->inter_ext_tx_cdf[1], ctx_tr->inter_ext_tx_cdf[1], 16,
                 CDF_SIZE(TX_TYPES));
  AVG_CDF_STRIDE(ctx_left->inter_ext_tx_cdf[2], ctx_tr->inter_ext_tx_cdf[2], 12,
                 CDF_SIZE(TX_TYPES));
  AVG_CDF_STRIDE(ctx_left->inter_ext_tx_cdf[3], ctx_tr->inter_ext_tx_cdf[3], 2,
                 CDF_SIZE(TX_TYPES));
  AVERAGE_CDF(ctx_left->cfl_sign_cdf, ctx_tr->cfl_sign_cdf, CFL_JOINT_SIGNS);
  AVERAGE_CDF(ctx_left->cfl_alpha_cdf, ctx_tr->cfl_alpha_cdf,
              CFL_ALPHABET_SIZE);
}